

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O3

void TPZBuildMultiphysicsMesh::AddWrap
               (TPZMultiphysicsElement *mfcel,int matskeleton,
               TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10> *ListGroupEl)

{
  byte bVar1;
  code *pcVar2;
  int64_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  TPZCompMesh *mesh;
  long lVar9;
  TPZCompEl *this;
  long *plVar10;
  TPZGeoEl *pTVar11;
  TPZCompMesh *pTVar12;
  TPZGeoEl *gel;
  TPZCompElHDivBound2<pzshape::TPZShapeQuad> *this_00;
  undefined8 uVar13;
  TPZConnect *this_01;
  TPZCompEl *pTVar14;
  TPZMultiphysicsElement *pTVar15;
  ulong uVar16;
  int iVar17;
  TPZStack<TPZMultiphysicsElement_*,_7> wrapEl;
  undefined8 local_100;
  int local_f8;
  TPZMultiphysicsElement *local_f0;
  TPZCreateApproximationSpace *local_e8;
  TPZStack<TPZMultiphysicsElement_*,_7> local_e0;
  TPZManVector<TPZMultiphysicsElement_*,_7> local_88;
  
  mesh = TPZCompEl::Mesh(&mfcel->super_TPZCompEl);
  this = (TPZCompEl *)0x0;
  lVar9 = (**(code **)(*(long *)&mfcel->super_TPZCompEl + 600))(mfcel,0);
  if (lVar9 != 0) {
    this = (TPZCompEl *)
           __dynamic_cast(lVar9,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
  }
  plVar10 = (long *)(**(code **)(*(long *)&mfcel->super_TPZCompEl + 600))(mfcel,1);
  iVar4 = (**(code **)(*plVar10 + 0x78))(plVar10);
  pTVar11 = TPZCompEl::Reference(&mfcel->super_TPZCompEl);
  pTVar12 = TPZCompEl::Mesh(&mfcel->super_TPZCompEl);
  if ((this == (TPZCompEl *)0x0) ||
     (iVar17 = pTVar12->fDimModel, iVar5 = (**(code **)(*(long *)pTVar11 + 0x210))(pTVar11),
     iVar5 != iVar17)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
               ,0x336);
  }
  local_88.super_TPZVec<TPZMultiphysicsElement_*>.fStore = local_88.fExtAlloc;
  local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements = 0;
  local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNAlloc = 0;
  local_88.super_TPZVec<TPZMultiphysicsElement_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019e0e10;
  TPZManVector<TPZMultiphysicsElement_*,_7>::Resize(&local_88,1);
  local_88.super_TPZVec<TPZMultiphysicsElement_*>.fStore
  [local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements - 1] = mfcel;
  local_e8 = &mesh->fCreate;
  local_f0 = mfcel;
  for (iVar17 = 0; iVar5 = (**(code **)(*(long *)pTVar11 + 0xf0))(),
      iVar3 = local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements, iVar17 < iVar5;
      iVar17 = iVar17 + 1) {
    iVar5 = (**(code **)(*(long *)pTVar11 + 0x208))(pTVar11,iVar17);
    iVar6 = (**(code **)(*(long *)pTVar11 + 0x210))(pTVar11);
    if (iVar5 == iVar6 + -1) {
      gel = (TPZGeoEl *)(**(code **)(*(long *)pTVar11 + 0x170))(pTVar11,iVar17,matskeleton);
      uVar7 = (**(code **)(*(long *)this + 0x250))(this,0,iVar17);
      lVar9 = (**(code **)(*(long *)this + 0xa8))(this,uVar7);
      bVar1 = *(byte *)(lVar9 + 0x14);
      pTVar12 = TPZCompEl::Mesh(this);
      pTVar12->fDefaultOrder = (uint)bVar1;
      iVar5 = (**(code **)(*(long *)pTVar11 + 0xc0))(pTVar11,iVar17);
      if (iVar5 == 1) {
        this_00 = (TPZCompElHDivBound2<pzshape::TPZShapeQuad> *)operator_new(0x80);
        pTVar12 = TPZCompEl::Mesh(this);
        TPZCompElHDivBound2<pzshape::TPZShapeLinear>::TPZCompElHDivBound2
                  ((TPZCompElHDivBound2<pzshape::TPZShapeLinear> *)this_00,pTVar12,gel,EHDivStandard
                  );
        uVar8 = (**(code **)(*(long *)this + 0x2f0))(this,iVar17);
        plVar10 = (long *)__dynamic_cast(this_00,&TPZInterpolationSpace::typeinfo,
                                         &TPZCompElHDivBound2<pzshape::TPZShapeLinear>::typeinfo,0);
        (**(code **)(*plVar10 + 0x2f8))(plVar10,2,uVar8);
      }
      else if (iVar5 == 2) {
        this_00 = (TPZCompElHDivBound2<pzshape::TPZShapeQuad> *)operator_new(0x80);
        pTVar12 = TPZCompEl::Mesh(this);
        TPZCompElHDivBound2<pzshape::TPZShapeTriang>::TPZCompElHDivBound2
                  ((TPZCompElHDivBound2<pzshape::TPZShapeTriang> *)this_00,pTVar12,gel,EHDivStandard
                  );
        uVar8 = (**(code **)(*(long *)this + 0x2f0))(this,iVar17);
        plVar10 = (long *)__dynamic_cast(this_00,&TPZInterpolationSpace::typeinfo,
                                         &TPZCompElHDivBound2<pzshape::TPZShapeTriang>::typeinfo,0);
        (**(code **)(*plVar10 + 0x2f8))(plVar10,6,uVar8);
      }
      else {
        if (iVar5 != 3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ElementType not found!",0x16);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x36c);
        }
        this_00 = (TPZCompElHDivBound2<pzshape::TPZShapeQuad> *)operator_new(0x88);
        pTVar12 = TPZCompEl::Mesh(this);
        TPZCompElHDivBound2<pzshape::TPZShapeQuad>::TPZCompElHDivBound2
                  (this_00,pTVar12,gel,EHDivStandard);
        uVar8 = (**(code **)(*(long *)this + 0x2f0))(this,iVar17);
        plVar10 = (long *)__dynamic_cast(this_00,&TPZInterpolationSpace::typeinfo,
                                         &TPZCompElHDivBound2<pzshape::TPZShapeQuad>::typeinfo,0);
        (**(code **)(*plVar10 + 0x2f8))(plVar10,8,uVar8);
      }
      uVar13 = (**(code **)(*(long *)this + 0xa0))(this,uVar7);
      this_01 = (TPZConnect *)
                (**(code **)(*(long *)&(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0xa8))(this_00,0);
      if (this_01->fDependList != (TPZDepend *)0x0) {
        iVar5 = (**(code **)(*(long *)&(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x90))(this_00);
        if (iVar5 != 1) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x375);
        }
        TPZConnect::RemoveDepend(this_01);
      }
      (**(code **)(*(long *)&(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x208))(this_00,0,uVar13);
      pTVar14 = TPZCreateApproximationSpace::CreateCompEl(local_e8,gel,mesh);
      pTVar15 = (TPZMultiphysicsElement *)
                __dynamic_cast(pTVar14,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0);
      (**(code **)(*(long *)&pTVar15->super_TPZCompEl + 0x248))(pTVar15,this_00,0);
      pcVar2 = *(code **)(*(long *)&local_f0->super_TPZCompEl + 600);
      if (iVar4 == 0xf) {
        lVar9 = (*pcVar2)(local_f0,1);
        if (lVar9 == 0) {
          local_100 = 0;
        }
        else {
          local_100 = __dynamic_cast(lVar9,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
        }
        local_f8 = iVar17;
        (**(code **)(*(long *)&pTVar15->super_TPZCompEl + 0x250))(pTVar15,&local_100,1);
      }
      else {
        lVar9 = (*pcVar2)(local_f0,1);
        if (lVar9 == 0) {
          local_100 = 0;
        }
        else {
          local_100 = __dynamic_cast(lVar9,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
        }
        local_f8 = iVar17;
        (**(code **)(*(long *)&pTVar15->super_TPZCompEl + 0x250))(pTVar15,&local_100,1);
      }
      (*local_88.super_TPZVec<TPZMultiphysicsElement_*>._vptr_TPZVec[3])
                (&local_88,local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements + 1);
      local_88.super_TPZVec<TPZMultiphysicsElement_*>.fStore
      [local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements - 1] = pTVar15;
    }
  }
  local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
  fStore = (TPZMultiphysicsElement **)0x0;
  local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
  fNElements = 0;
  local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
  fNAlloc = 0;
  if (local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements < 8) {
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    fStore = local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.fExtAlloc;
    if (local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements < 1) goto LAB_013b3ab1;
  }
  else {
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    fStore = (TPZMultiphysicsElement **)
             operator_new__(-(ulong)((ulong)local_88.super_TPZVec<TPZMultiphysicsElement_*>.
                                            fNElements >> 0x3d != 0) |
                            local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNElements * 8);
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    fNAlloc = iVar3;
  }
  uVar16 = 0;
  do {
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    fStore[uVar16] = local_88.super_TPZVec<TPZMultiphysicsElement_*>.fStore[uVar16];
    uVar16 = uVar16 + 1;
  } while (iVar3 != uVar16);
LAB_013b3ab1:
  local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
  fNElements = iVar3;
  local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019e0e10;
  TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10>::push_back(ListGroupEl,&local_e0);
  if (local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.
      super_TPZVec<TPZMultiphysicsElement_*>.fStore ==
      local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.fExtAlloc) {
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    fStore = (TPZMultiphysicsElement **)0x0;
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    fNAlloc = 0;
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    _vptr_TPZVec = (_func_int **)&PTR__TPZVec_019e0e90;
  }
  else {
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    fNAlloc = 0;
    local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.super_TPZVec<TPZMultiphysicsElement_*>.
    _vptr_TPZVec = (_func_int **)&PTR__TPZVec_019e0e90;
    if (local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.
        super_TPZVec<TPZMultiphysicsElement_*>.fStore != (TPZMultiphysicsElement **)0x0) {
      operator_delete__(local_e0.super_TPZManVector<TPZMultiphysicsElement_*,_7>.
                        super_TPZVec<TPZMultiphysicsElement_*>.fStore);
    }
  }
  if (local_88.super_TPZVec<TPZMultiphysicsElement_*>.fStore != local_88.fExtAlloc) {
    local_88.super_TPZVec<TPZMultiphysicsElement_*>.fNAlloc = 0;
    local_88.super_TPZVec<TPZMultiphysicsElement_*>._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_019e0e90;
    if (local_88.super_TPZVec<TPZMultiphysicsElement_*>.fStore != (TPZMultiphysicsElement **)0x0) {
      operator_delete__(local_88.super_TPZVec<TPZMultiphysicsElement_*>.fStore);
    }
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::AddWrap(TPZMultiphysicsElement *mfcel, int matskeleton, TPZStack< TPZStack<TPZMultiphysicsElement *,7> > &ListGroupEl)
{
    TPZCompMesh *multiMesh = mfcel->Mesh();
    TPZInterpolationSpace *hdivel = dynamic_cast<TPZInterpolationSpace *> (mfcel->Element(0));
    TPZCompEl *cel = dynamic_cast<TPZCompEl *>(mfcel->Element(1));
    MElementType celType = cel->Type();
    
    TPZGeoEl *gel = mfcel->Reference();
    
    int dimMesh = mfcel->Mesh()->Dimension();
    if (!hdivel || !cel || gel->Dimension() != dimMesh) {
        DebugStop();
    }
    
    //wrap element
    TPZStack<TPZMultiphysicsElement *, 7> wrapEl;
    wrapEl.push_back(mfcel);
    
    for (int side = 0; side < gel->NSides(); side++)
    {
        if (gel->SideDimension(side) != gel->Dimension()-1) {
            continue;
        }
        TPZGeoEl *gelbound = gel->CreateBCGeoEl(side, matskeleton);
        TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(hdivel);
        int loccon = intel->SideConnectLocId(0,side);
        
        //Impose that the skeleton element has the same polynomial order  to the element of side.
        TPZConnect &conside = intel->Connect(loccon);
        int sideorder = conside.Order();
        intel->Mesh()->SetDefaultOrder(sideorder);
                
        TPZInterpolationSpace *bound;
        MElementType elType = gel->Type(side);
        switch(elType)
        {
            case(EOned)://line
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeLinear>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeLinear> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeLinear> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeLinear::NSides-1,sideorient);
                break;
            }
            case(ETriangle)://triangle
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeTriang>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeTriang> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeTriang> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeTriang::NSides-1,sideorient);
                break;
            }
            case(EQuadrilateral)://quadrilateral
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeQuad>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeQuad> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeQuad> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeQuad::NSides-1,sideorient);
                break;
            }
                
            default:
            {
                bound=0;
                std::cout << "ElementType not found!";
                DebugStop();
                break;
            }
        }
        
        int64_t sideconnectindex = intel->ConnectIndex(loccon);
        
        TPZConnect &co = bound->Connect(0);
        if(co.HasDependency()){
            if(bound->NConnects()!=1) DebugStop();
            //int64_t cindex_bound = bound->ConnectIndex(0);
            co.RemoveDepend();
        }
        bound->SetConnectIndex(0, sideconnectindex);
        //bound->Print(std::cout);
        
        TPZCompEl *newMFBound = multiMesh->CreateCompEl(gelbound);
        TPZMultiphysicsElement *locMF = dynamic_cast<TPZMultiphysicsElement *>(newMFBound);
        
        locMF->AddElement(bound, 0);
        //locMF->Print(std::cout);
        
        if(celType==EDiscontinuous){
            TPZCompElDisc *discel = dynamic_cast<TPZCompElDisc *>(mfcel->Element(1));
            locMF->AddElement(TPZCompElSide(discel,side), 1);
        }else{
            TPZInterpolationSpace *contcel = dynamic_cast<TPZInterpolationSpace *>(mfcel->Element(1));
            locMF->AddElement(TPZCompElSide(contcel,side), 1);
        }
        
        wrapEl.push_back(locMF);
    }
    
    ListGroupEl.push_back(wrapEl);
}